

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

bool __thiscall
Clasp::Cli::ClaspCliConfig::setAppDefaults
          (ClaspCliConfig *this,ConfigKey config,uint8 mode,ParsedOpts *seen,ProblemType t)

{
  int iVar1;
  string *psVar2;
  size_type sVar3;
  undefined4 extraout_var;
  char *exp;
  uint line;
  ClaspCliConfig *pCVar4;
  string mem;
  ConfigIter local_38;
  
  mem._M_dataplus._M_p = (pointer)&mem.field_2;
  mem._M_string_length = 0;
  mem.field_2._M_local_buf[0] = '\0';
  if (t != Asp) {
    psVar2 = getOptionName(this,3,&mem);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&seen->parsed_,psVar2);
    if (sVar3 == 0) {
      iVar1 = setOption(this,3,mode,0,"2,iter=20,occ=25,time=120");
      if (iVar1 == 0) {
        exp = "setOption(opt_sat_prepro, mode, 0, \"2,iter=20,occ=25,time=120\")";
        line = 0x442;
        goto LAB_00123983;
      }
    }
  }
  pCVar4 = this;
  if ((config == config_many && (mode & 2) == 0) && t == Asp) {
    psVar2 = getOptionName(this,0x38,&mem);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&seen->parsed_,psVar2);
    if (sVar3 == 0) {
      iVar1 = setOption(this,0x38,mode,0,"3");
      if (iVar1 == 0) {
        exp = "seen.count(getOptionName(opt_eq, mem)) || setOption(opt_eq, mode, 0, \"3\")";
        line = 0x445;
        goto LAB_00123983;
      }
    }
    psVar2 = getOptionName(this,0x37,&mem);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&seen->parsed_,psVar2);
    if (sVar3 == 0) {
      iVar1 = setOption(this,0x37,mode,0,"dynamic");
      if (iVar1 == 0) {
        exp = 
        "seen.count(getOptionName(opt_trans_ext, mem)) || setOption(opt_trans_ext, mode, 0, \"dynamic\")"
        ;
        line = 0x446;
LAB_00123983:
        Potassco::fail(-2,
                       "bool Clasp::Cli::ClaspCliConfig::setAppDefaults(ConfigKey, uint8, const ParsedOpts &, ProblemType)"
                       ,line,exp,(char *)0x0);
      }
    }
  }
  else {
    if (config == config_nolearn) goto LAB_00123950;
    if ((mode & 2) != 0) {
      pCVar4 = (ClaspCliConfig *)(this->super_ClaspConfig).tester_;
    }
  }
  iVar1 = (*(pCVar4->super_ClaspConfig).super_BasicSatConfig.super_UserConfiguration.
            super_Configuration._vptr_Configuration[6])(pCVar4,0);
  if ((*(byte *)(CONCAT44(extraout_var,iVar1) + 6) & 8) != 0) {
    local_38.base_ = "/[nolearn]";
    setConfig(this,&local_38,mode | 4,0,seen,(ParsedOpts *)0x0);
  }
LAB_00123950:
  std::__cxx11::string::~string((string *)&mem);
  return true;
}

Assistant:

bool ClaspCliConfig::setAppDefaults(ConfigKey config, uint8 mode, const ParsedOpts& seen, ProblemType t) {
	std::string mem;
	if (t != Problem_t::Asp && !seen.count(getOptionName(opt_sat_prepro, mem))) {
		POTASSCO_REQUIRE(setOption(opt_sat_prepro, mode, 0, "2,iter=20,occ=25,time=120"));
	}
	if (!isTester(mode) && config == config_many && t == Problem_t::Asp) {
		POTASSCO_REQUIRE(seen.count(getOptionName(opt_eq, mem)) || setOption(opt_eq, mode, 0, "3"));
		POTASSCO_REQUIRE(seen.count(getOptionName(opt_trans_ext, mem)) || setOption(opt_trans_ext, mode, 0, "dynamic"));
	}
	if (config != config_nolearn && active(this, mode)->solver(0).search == SolverParams::no_learning) {
		POTASSCO_REQUIRE(setConfig(getConfig(config_nolearn), mode | mode_relaxed, 0, seen, 0));
	}
	return true;
}